

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.cpp
# Opt level: O0

utf8proc_bool
duckdb::utf8proc_grapheme_break_stateful
          (utf8proc_int32_t c1,utf8proc_int32_t c2,utf8proc_int32_t *state)

{
  utf8proc_bool uVar1;
  utf8proc_property_t *state_00;
  undefined8 in_RDX;
  int in_ESI;
  int in_EDI;
  int unaff_retaddr;
  utf8proc_property_t *p2;
  utf8proc_property_t *p1;
  undefined8 in_stack_ffffffffffffffe0;
  utf8proc_int32_t uc;
  int ticb;
  
  ticb = (int)((ulong)in_RDX >> 0x20);
  uc = (utf8proc_int32_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  state_00 = utf8proc_get_property(uc);
  utf8proc_get_property(uc);
  uVar1 = grapheme_break_extended(unaff_retaddr,in_EDI,in_ESI,ticb,(utf8proc_int32_t *)state_00);
  return uVar1;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_bool utf8proc_grapheme_break_stateful(
    utf8proc_int32_t c1, utf8proc_int32_t c2, utf8proc_int32_t *state) {

  const utf8proc_property_t *p1 = utf8proc_get_property(c1);
  const utf8proc_property_t *p2 = utf8proc_get_property(c2);
  return grapheme_break_extended(p1->boundclass,
                                 p2->boundclass,
                                 p1->indic_conjunct_break,
                                 p2->indic_conjunct_break,
                                 state);
}